

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  uint local_64;
  uint local_54;
  uint local_44;
  char *target;
  char **ppcStack_30;
  int tok;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  ppcStack_30 = nextTokPtr;
  nextTokPtr_local = (char **)end;
  end_local = ptr;
  ptr_local = (char *)enc;
  if (ptr[1] == '\0') {
    local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  }
  else {
    local_44 = unicode_byte_type(ptr[1],*ptr);
  }
  switch(local_44) {
  case 5:
    if ((long)nextTokPtr_local - (long)end_local < 2) {
      return -2;
    }
    *ppcStack_30 = end_local;
    return 0;
  case 6:
    if ((long)nextTokPtr_local - (long)end_local < 3) {
      return -2;
    }
    *ppcStack_30 = end_local;
    return 0;
  case 7:
    if ((long)nextTokPtr_local - (long)end_local < 4) {
      return -2;
    }
    *ppcStack_30 = end_local;
    return 0;
  default:
    *ppcStack_30 = end_local;
    return 0;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)end_local[1]] * 8 +
               ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
      *ppcStack_30 = end_local;
      return 0;
    }
  case 0x16:
  case 0x18:
    pcVar2 = end_local;
  }
  do {
    end_local = pcVar2 + 2;
    if ((long)nextTokPtr_local - (long)end_local < 2) {
      return -1;
    }
    if (pcVar2[3] == '\0') {
      local_54 = (uint)(byte)ptr_local[(ulong)(byte)*end_local + 0x88];
    }
    else {
      local_54 = unicode_byte_type(pcVar2[3],*end_local);
    }
    pcVar2 = end_local;
    switch(local_54) {
    case 5:
      if ((long)nextTokPtr_local - (long)end_local < 2) {
        return -2;
      }
      *ppcStack_30 = end_local;
      return 0;
    case 6:
      if ((long)nextTokPtr_local - (long)end_local < 3) {
        return -2;
      }
      *ppcStack_30 = end_local;
      return 0;
    case 7:
      if ((long)nextTokPtr_local - (long)end_local < 4) {
        return -2;
      }
      *ppcStack_30 = end_local;
      return 0;
    case 9:
    case 10:
    case 0x15:
      iVar1 = little2_checkPiTarget((ENCODING *)ptr_local,ptr,end_local,(int *)((long)&target + 4));
      if (iVar1 == 0) {
        *ppcStack_30 = end_local;
        return 0;
      }
      pcVar2 = end_local + 2;
      do {
        end_local = pcVar2;
        if ((long)nextTokPtr_local - (long)end_local < 2) {
          return -1;
        }
        if (end_local[1] == '\0') {
          local_64 = (uint)(byte)ptr_local[(ulong)(byte)*end_local + 0x88];
        }
        else {
          local_64 = unicode_byte_type(end_local[1],*end_local);
        }
        switch(local_64) {
        case 0:
        case 1:
        case 8:
          *ppcStack_30 = end_local;
          return 0;
        default:
          pcVar2 = end_local + 2;
          break;
        case 5:
          if ((long)nextTokPtr_local - (long)end_local < 2) {
            return -2;
          }
          pcVar2 = end_local + 2;
          break;
        case 6:
          if ((long)nextTokPtr_local - (long)end_local < 3) {
            return -2;
          }
          pcVar2 = end_local + 3;
          break;
        case 7:
          if ((long)nextTokPtr_local - (long)end_local < 4) {
            return -2;
          }
          pcVar2 = end_local + 4;
          break;
        case 0xf:
          pcVar2 = end_local + 2;
          if ((long)nextTokPtr_local - (long)pcVar2 < 2) {
            return -1;
          }
          if ((end_local[3] == '\0') && (*pcVar2 == '>')) {
            *ppcStack_30 = end_local + 4;
            return target._4_4_;
          }
        }
      } while( true );
    case 0xf:
      iVar1 = little2_checkPiTarget((ENCODING *)ptr_local,ptr,end_local,(int *)((long)&target + 4));
      if (iVar1 == 0) {
        *ppcStack_30 = end_local;
        return 0;
      }
      pcVar2 = end_local + 2;
      if ((long)nextTokPtr_local - (long)pcVar2 < 2) {
        return -1;
      }
      if ((end_local[3] == '\0') && (*pcVar2 == '>')) {
        *ppcStack_30 = end_local + 4;
        return target._4_4_;
      }
    default:
      end_local = pcVar2;
      *ppcStack_30 = end_local;
      return 0;
    case 0x1d:
      if ((namingBitmap
           [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)end_local[1]] * 8 +
                 ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
        *ppcStack_30 = end_local;
        return 0;
      }
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}